

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottieitem.cpp
# Opt level: O3

bool __thiscall
rlottie::internal::renderer::Stroke::updateContent
          (Stroke *this,int frameNo,VMatrix *matrix,float alpha)

{
  Filter<rlottie::internal::model::Stroke> *this_00;
  Drawable *this_01;
  vector<float,_std::allocator<float>_> *result;
  CapStyle cap;
  JoinStyle join;
  Stroke *pSVar1;
  VPointF VVar2;
  long lVar3;
  float *elm;
  pointer pfVar4;
  pointer pfVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  Color CVar9;
  VColor color;
  VBrush brush;
  VColor local_54;
  VPointF local_50;
  VPointF local_48;
  VBrush local_40;
  
  this_00 = &this->mModel;
  fVar6 = model::Filter<rlottie::internal::model::Stroke>::opacity(this_00,frameNo);
  CVar9 = model::Filter<rlottie::internal::model::Stroke>::color(this_00,frameNo);
  local_54 = (VColor)((int)(fVar6 * alpha * 255.0) & 0xffU |
                     ((int)(CVar9.r * 255.0) & 0xffU) << 8 |
                     ((int)(CVar9.g * 255.0) & 0xffU) << 0x10 | (int)(CVar9.b * 255.0) << 0x18);
  VBrush::VBrush(&local_40,&local_54);
  this_01 = &(this->super_Paint).mDrawable;
  (this->super_Paint).mDrawable.super_VDrawable.mBrush.mType = local_40.mType;
  *(undefined4 *)&(this->super_Paint).mDrawable.super_VDrawable.mBrush.field_0x4 = local_40._4_4_;
  (this->super_Paint).mDrawable.super_VDrawable.mBrush.field_1 = local_40.field_1;
  local_48.mx = 0.0;
  local_48.my = 0.0;
  local_50.mx = 1.41421;
  local_50.my = 1.41421;
  local_48 = VMatrix::map(matrix,&local_48);
  VVar2 = VMatrix::map(matrix,&local_50);
  fVar8 = VVar2.mx - local_48.mx;
  fVar6 = VVar2.my - local_48.my;
  fVar8 = SQRT(fVar8 * fVar8 + fVar6 * fVar6) * 0.5;
  pSVar1 = (this->mModel).super_FilterBase<rlottie::internal::model::Stroke>.model_;
  cap = pSVar1->mCapStyle;
  join = pSVar1->mJoinStyle;
  fVar6 = pSVar1->mMiterLimit;
  fVar7 = model::Filter<rlottie::internal::model::Stroke>::strokeWidth(this_00,frameNo);
  VDrawable::setStrokeInfo(&this_01->super_VDrawable,cap,join,fVar6,fVar7 * fVar8);
  pSVar1 = (this->mModel).super_FilterBase<rlottie::internal::model::Stroke>.model_;
  if ((pSVar1->mDash).mData.
      super__Vector_base<rlottie::internal::model::Property<float,_void>,_std::allocator<rlottie::internal::model::Property<float,_void>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      *(pointer *)
       ((long)&(pSVar1->mDash).mData.
               super__Vector_base<rlottie::internal::model::Property<float,_void>,_std::allocator<rlottie::internal::model::Property<float,_void>_>_>
               ._M_impl.super__Vector_impl_data + 8)) {
    lVar3 = __tls_get_addr(&PTR_00144f70);
    if (*(char *)(lVar3 + 0x58) == '\0') {
      updateContent();
    }
    result = (vector<float,_std::allocator<float>_> *)(lVar3 + 0x40);
    pfVar4 = (result->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if (*(pointer *)(lVar3 + 0x48) != pfVar4) {
      *(pointer *)(lVar3 + 0x48) = pfVar4;
    }
    if (*(char *)(lVar3 + 0x58) == '\0') {
      updateContent();
    }
    model::Dash::getDashInfo
              (&((this_00->super_FilterBase<rlottie::internal::model::Stroke>).model_)->mDash,
               frameNo,result);
    if (*(char *)(lVar3 + 0x58) == '\0') {
      updateContent();
    }
    pfVar4 = (result->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pfVar5 = *(pointer *)(lVar3 + 0x48);
    if (pfVar4 != pfVar5) {
      if (*(char *)(lVar3 + 0x58) == '\0') {
        *(undefined1 *)(lVar3 + 0x58) = 1;
        *(undefined8 *)(lVar3 + 0x40) = 0;
        *(undefined8 *)(lVar3 + 0x48) = 0;
        *(undefined8 *)(lVar3 + 0x50) = 0;
        __cxa_thread_atexit(std::vector<float,_std::allocator<float>_>::~vector,
                            (undefined8 *)(lVar3 + 0x40),&__dso_handle);
        pfVar4 = (result->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pfVar5 = *(pointer *)(lVar3 + 0x48);
      }
      for (; pfVar4 != pfVar5; pfVar4 = pfVar4 + 1) {
        *pfVar4 = *pfVar4 * fVar8;
      }
      if (*(char *)(lVar3 + 0x58) == '\0') {
        updateContent();
      }
      VDrawable::setDashInfo(&this_01->super_VDrawable,result);
    }
  }
  return local_54.a != '\0';
}

Assistant:

bool renderer::Stroke::updateContent(int frameNo, const VMatrix &matrix,
                                     float alpha)
{
    auto combinedAlpha = alpha * mModel.opacity(frameNo);
    auto color = mModel.color(frameNo).toColor(combinedAlpha);

    VBrush brush(color);
    mDrawable.setBrush(brush);
    float scale = matrix.scale();
    mDrawable.setStrokeInfo(mModel.capStyle(), mModel.joinStyle(),
                            mModel.miterLimit(),
                            mModel.strokeWidth(frameNo) * scale);

    if (mModel.hasDashInfo()) {
        Dash_Vector.clear();
        mModel.getDashInfo(frameNo, Dash_Vector);
        if (!Dash_Vector.empty()) {
            for (auto &elm : Dash_Vector) elm *= scale;
            mDrawable.setDashInfo(Dash_Vector);
        }
    }

    return !color.isTransparent();
}